

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

int __thiscall
icu_63::MeasureUnit::clone
          (MeasureUnit *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    *puVar1 = &PTR__MeasureUnit_003e8db0;
    *(int32_t *)(puVar1 + 1) = this->fTypeId;
    *(int32_t *)((long)puVar1 + 0xc) = this->fSubTypeId;
    strcpy((char *)(puVar1 + 2),this->fCurrency);
  }
  return (int)puVar1;
}

Assistant:

UObject *MeasureUnit::clone() const {
    return new MeasureUnit(*this);
}